

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::Ogre::OgreImporter::CanRead
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  IOSystem *pIVar1;
  bool bVar2;
  bool local_fa;
  allocator<char> local_e1;
  string local_e0;
  char *local_c0;
  char *tokens [1];
  string local_b0;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  OgreImporter *this_local;
  
  local_29 = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  if (checkSig) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,".mesh.xml",(allocator<char> *)((long)tokens + 7));
    bVar2 = EndsWith(pFile,&local_b0,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)tokens + 7));
    pIVar1 = pIOHandler_local;
    if (bVar2) {
      local_c0 = "<mesh>";
      this_local._7_1_ =
           BaseImporter::SearchFileHeaderForToken
                     (pIStack_28,(string *)pIOHandler_local,&local_c0,1,200,false,false);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,".mesh",&local_e1);
      this_local._7_1_ = EndsWith((string *)pIVar1,&local_e0,false);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
  }
  else {
    std::allocator<char>::allocator();
    local_8a = 0;
    local_8b = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,".mesh.xml",&local_51);
    bVar2 = EndsWith(pFile,&local_50,false);
    pIVar1 = pIOHandler_local;
    local_fa = true;
    if (!bVar2) {
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,".mesh",&local_89);
      local_8b = 1;
      local_fa = EndsWith((string *)pIVar1,&local_88,false);
    }
    this_local._7_1_ = local_fa;
    if ((local_8b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OgreImporter::CanRead(const std::string &pFile, Assimp::IOSystem *pIOHandler, bool checkSig) const
{
    if (!checkSig) {
        return EndsWith(pFile, ".mesh.xml", false) || EndsWith(pFile, ".mesh", false);
    }

    if (EndsWith(pFile, ".mesh.xml", false))
    {
        const char* tokens[] = { "<mesh>" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }
    else
    {
        /// @todo Read and validate first header chunk?
        return EndsWith(pFile, ".mesh", false);
    }
}